

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O3

void __thiscall
absl::synchronization_internal::ThreadPool::ThreadPool(ThreadPool *this,int num_threads)

{
  thread local_58;
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  *local_50;
  ThreadPool *local_48;
  code *local_40;
  undefined8 local_38;
  
  local_50 = &this->queue_;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->mu_).mu_.super___atomic_base<long>._M_i = 0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->queue_).c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map((_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                    )local_50,0);
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < num_threads) {
    do {
      local_40 = WorkLoop;
      local_38 = 0;
      local_48 = this;
      std::thread::
      thread<void(absl::synchronization_internal::ThreadPool::*)(),absl::synchronization_internal::ThreadPool*,void>
                (&local_58,(offset_in_ThreadPool_to_subr *)&local_40,&local_48);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&this->threads_,&local_58);
      if (local_58._M_id._M_thread != 0) {
        std::terminate();
      }
      num_threads = num_threads + -1;
    } while (num_threads != 0);
  }
  return;
}

Assistant:

explicit ThreadPool(int num_threads) {
    for (int i = 0; i < num_threads; ++i) {
      threads_.push_back(std::thread(&ThreadPool::WorkLoop, this));
    }
  }